

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_add_nolock_(event *ev,timeval *tv,int tv_is_absolute)

{
  event_base *base_00;
  unsigned_long uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  event_callback *peVar5;
  unsigned_long uVar6;
  event_callback *peVar7;
  common_timeout_list *ctl_00;
  event *peVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  event *top;
  common_timeout_list *ctl;
  timeval tmp;
  undefined1 auStack_48 [4];
  int common_timeout;
  timeval now;
  int notify;
  int res;
  event_base *base;
  int tv_is_absolute_local;
  timeval *tv_local;
  event *ev_local;
  
  base_00 = ev->ev_base;
  now.tv_usec._4_4_ = 0;
  now.tv_usec._0_4_ = 0;
  if (((base_00->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar3 = evthread_is_debug_lock_held_(base_00->th_base_lock), iVar3 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xa2f,"evthread_is_debug_lock_held_((base)->th_base_lock)","event_add_nolock_");
  }
  event_debug_assert_is_setup_(ev);
  if (event_debug_logging_mask_ != 0) {
    pcVar9 = " ";
    if ((ev->ev_events & 2U) != 0) {
      pcVar9 = "EV_READ ";
    }
    pcVar10 = " ";
    if ((ev->ev_events & 4U) != 0) {
      pcVar10 = "EV_WRITE ";
    }
    pcVar11 = " ";
    if ((ev->ev_events & 0x80U) != 0) {
      pcVar11 = "EV_CLOSED ";
    }
    pcVar12 = " ";
    if (tv != (timeval *)0x0) {
      pcVar12 = "EV_TIMEOUT ";
    }
    event_debugx_("event_add: event: %p (fd %d), %s%s%s%scall %p",ev,(ulong)(uint)ev->ev_fd,pcVar9,
                  pcVar10,pcVar11,pcVar12,(ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (((ev->ev_evcallback).evcb_flags & 0xff00U) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xa3c,"!(ev->ev_flags & ~EVLIST_ALL)","event_add_nolock_");
  }
  if (((ev->ev_evcallback).evcb_flags & 0x40U) != 0) {
    return -1;
  }
  if ((tv != (timeval *)0x0) && (((ev->ev_evcallback).evcb_flags & 1U) == 0)) {
    uVar4 = min_heap_size_(&base_00->timeheap);
    iVar3 = min_heap_reserve_(&base_00->timeheap,uVar4 + 1);
    if (iVar3 == -1) {
      return -1;
    }
  }
  peVar7 = base_00->current_event;
  peVar5 = event_to_event_callback(ev);
  if (((peVar7 == peVar5) && ((ev->ev_events & 8U) != 0)) &&
     ((evthread_id_fn_ != (_func_unsigned_long *)0x0 &&
      ((uVar1 = base_00->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar1 != uVar6 &&
       (base_00->current_event_waiters = base_00->current_event_waiters + 1,
       base_00->current_event_cond != (void *)0x0)))))) {
    (*evthread_cond_fns_.wait_condition)
              (base_00->current_event_cond,base_00->th_base_lock,(timeval *)0x0);
  }
  if (((ev->ev_events & 0x8eU) != 0) && (((ev->ev_evcallback).evcb_flags & 0x2aU) == 0)) {
    if ((ev->ev_events & 0x86U) == 0) {
      if ((ev->ev_events & 8U) != 0) {
        now.tv_usec._4_4_ = evmap_signal_add_(base_00,ev->ev_fd,ev);
      }
    }
    else {
      now.tv_usec._4_4_ = evmap_io_add_(base_00,ev->ev_fd,ev);
    }
    if (now.tv_usec._4_4_ != -1) {
      event_queue_insert_inserted(base_00,ev);
    }
    if (now.tv_usec._4_4_ == 1) {
      now.tv_usec._0_4_ = 1;
      now.tv_usec._4_4_ = 0;
    }
  }
  if ((now.tv_usec._4_4_ != -1) && (tv != (timeval *)0x0)) {
    if (((ev->ev_evcallback).evcb_closure == '\x02') && (tv_is_absolute == 0)) {
      (ev->ev_).ev_io.ev_timeout.tv_sec = tv->tv_sec;
      (ev->ev_).ev_io.ev_timeout.tv_usec = tv->tv_usec;
    }
    if (((ev->ev_evcallback).evcb_flags & 1U) != 0) {
      event_queue_remove_timeout(base_00,ev);
    }
    if ((((ev->ev_evcallback).evcb_flags & 8U) != 0) && ((ev->ev_res & 1U) != 0)) {
      if (((ev->ev_events & 8U) != 0) &&
         (((ev->ev_).ev_signal.ev_ncalls != 0 && ((ev->ev_).ev_io.ev_timeout.tv_usec != 0)))) {
        *(ev->ev_).ev_signal.ev_pncalls = 0;
      }
      peVar7 = event_to_event_callback(ev);
      event_queue_remove_active(base_00,peVar7);
    }
    gettime(base_00,(timeval *)auStack_48);
    iVar3 = is_common_timeout(tv,base_00);
    if (tv_is_absolute == 0) {
      if (iVar3 == 0) {
        (ev->ev_timeout).tv_sec = _auStack_48 + tv->tv_sec;
        (ev->ev_timeout).tv_usec = now.tv_sec + tv->tv_usec;
        if (999999 < (ev->ev_timeout).tv_usec) {
          (ev->ev_timeout).tv_sec = (ev->ev_timeout).tv_sec + 1;
          (ev->ev_timeout).tv_usec = (ev->ev_timeout).tv_usec + -1000000;
        }
      }
      else {
        uVar2 = tv->tv_usec;
        (ev->ev_timeout).tv_sec = _auStack_48 + tv->tv_sec;
        (ev->ev_timeout).tv_usec = now.tv_sec + (uVar2 & 0xfffff);
        if (999999 < (ev->ev_timeout).tv_usec) {
          (ev->ev_timeout).tv_sec = (ev->ev_timeout).tv_sec + 1;
          (ev->ev_timeout).tv_usec = (ev->ev_timeout).tv_usec + -1000000;
        }
        (ev->ev_timeout).tv_usec = tv->tv_usec & 0xfffffffffff00000U | (ev->ev_timeout).tv_usec;
      }
    }
    else {
      (ev->ev_timeout).tv_sec = tv->tv_sec;
      (ev->ev_timeout).tv_usec = tv->tv_usec;
    }
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("event_add: event %p, timeout in %d seconds %d useconds, call %p",ev,
                    tv->tv_sec & 0xffffffff,tv->tv_usec & 0xffffffff,
                    (ev->ev_evcallback).evcb_cb_union.evcb_callback);
    }
    event_queue_insert_timeout(base_00,ev);
    if (iVar3 == 0) {
      iVar3 = min_heap_elt_is_top_(ev);
      if (iVar3 == 0) {
        peVar8 = min_heap_top_(&base_00->timeheap);
        if (peVar8 != (event *)0x0) {
          if ((peVar8->ev_timeout).tv_sec == _auStack_48) {
            if (now.tv_sec <= (peVar8->ev_timeout).tv_usec) goto LAB_00388244;
          }
          else if (_auStack_48 <= (peVar8->ev_timeout).tv_sec) goto LAB_00388244;
          now.tv_usec._0_4_ = 1;
        }
      }
      else {
        now.tv_usec._0_4_ = 1;
      }
    }
    else {
      ctl_00 = get_common_timeout_list(base_00,&ev->ev_timeout);
      if (ev == (ctl_00->events).tqh_first) {
        common_timeout_schedule(ctl_00,(timeval *)auStack_48,ev);
      }
    }
  }
LAB_00388244:
  if ((((now.tv_usec._4_4_ != -1) && ((int)now.tv_usec != 0)) &&
      (evthread_id_fn_ != (_func_unsigned_long *)0x0)) &&
     ((base_00->running_loop != 0 &&
      (uVar1 = base_00->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar1 != uVar6)))) {
    evthread_notify_base(base_00);
  }
  event_debug_note_add_(ev);
  return now.tv_usec._4_4_;
}

Assistant:

int
event_add_nolock_(struct event *ev, const struct timeval *tv,
    int tv_is_absolute)
{
	struct event_base *base = ev->ev_base;
	int res = 0;
	int notify = 0;

	EVENT_BASE_ASSERT_LOCKED(base);
	event_debug_assert_is_setup_(ev);

	event_debug((
		 "event_add: event: %p (fd "EV_SOCK_FMT"), %s%s%s%scall %p",
		 ev,
		 EV_SOCK_ARG(ev->ev_fd),
		 ev->ev_events & EV_READ ? "EV_READ " : " ",
		 ev->ev_events & EV_WRITE ? "EV_WRITE " : " ",
		 ev->ev_events & EV_CLOSED ? "EV_CLOSED " : " ",
		 tv ? "EV_TIMEOUT " : " ",
		 ev->ev_callback));

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return (-1);
	}

	/*
	 * prepare for timeout insertion further below, if we get a
	 * failure on any step, we should not change any state.
	 */
	if (tv != NULL && !(ev->ev_flags & EVLIST_TIMEOUT)) {
		if (min_heap_reserve_(&base->timeheap,
			1 + min_heap_size_(&base->timeheap)) == -1)
			return (-1);  /* ENOMEM == errno */
	}

	/* If the main thread is currently executing a signal event's
	 * callback, and we are not the main thread, then we want to wait
	 * until the callback is done before we mess with the event, or else
	 * we can race on ev_ncalls and ev_pncalls below. */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->current_event == event_to_event_callback(ev) &&
	    (ev->ev_events & EV_SIGNAL)
	    && !EVBASE_IN_THREAD(base)) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	if ((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL)) &&
	    !(ev->ev_flags & (EVLIST_INSERTED|EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_add_(base, ev->ev_fd, ev);
		else if (ev->ev_events & EV_SIGNAL)
			res = evmap_signal_add_(base, (int)ev->ev_fd, ev);
		if (res != -1)
			event_queue_insert_inserted(base, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
	}

	/*
	 * we should change the timeout state only if the previous event
	 * addition succeeded.
	 */
	if (res != -1 && tv != NULL) {
		struct timeval now;
		int common_timeout;
#ifdef USE_REINSERT_TIMEOUT
		int was_common;
		int old_timeout_idx;
#endif

		/*
		 * for persistent timeout events, we remember the
		 * timeout value and re-add the event.
		 *
		 * If tv_is_absolute, this was already set.
		 */
		if (ev->ev_closure == EV_CLOSURE_EVENT_PERSIST && !tv_is_absolute)
			ev->ev_io_timeout = *tv;

#ifndef USE_REINSERT_TIMEOUT
		if (ev->ev_flags & EVLIST_TIMEOUT) {
			event_queue_remove_timeout(base, ev);
		}
#endif

		/* Check if it is active due to a timeout.  Rescheduling
		 * this timeout before the callback can be executed
		 * removes it from the active list. */
		if ((ev->ev_flags & EVLIST_ACTIVE) &&
		    (ev->ev_res & EV_TIMEOUT)) {
			if (ev->ev_events & EV_SIGNAL) {
				/* See if we are just active executing
				 * this event in a loop
				 */
				if (ev->ev_ncalls && ev->ev_pncalls) {
					/* Abort loop */
					*ev->ev_pncalls = 0;
				}
			}

			event_queue_remove_active(base, event_to_event_callback(ev));
		}

		gettime(base, &now);

		common_timeout = is_common_timeout(tv, base);
#ifdef USE_REINSERT_TIMEOUT
		was_common = is_common_timeout(&ev->ev_timeout, base);
		old_timeout_idx = COMMON_TIMEOUT_IDX(&ev->ev_timeout);
#endif

		if (tv_is_absolute) {
			ev->ev_timeout = *tv;
		} else if (common_timeout) {
			struct timeval tmp = *tv;
			tmp.tv_usec &= MICROSECONDS_MASK;
			evutil_timeradd(&now, &tmp, &ev->ev_timeout);
			ev->ev_timeout.tv_usec |=
			    (tv->tv_usec & ~MICROSECONDS_MASK);
		} else {
			evutil_timeradd(&now, tv, &ev->ev_timeout);
		}

		event_debug((
			 "event_add: event %p, timeout in %d seconds %d useconds, call %p",
			 ev, (int)tv->tv_sec, (int)tv->tv_usec, ev->ev_callback));

#ifdef USE_REINSERT_TIMEOUT
		event_queue_reinsert_timeout(base, ev, was_common, common_timeout, old_timeout_idx);
#else
		event_queue_insert_timeout(base, ev);
#endif

		if (common_timeout) {
			struct common_timeout_list *ctl =
			    get_common_timeout_list(base, &ev->ev_timeout);
			if (ev == TAILQ_FIRST(&ctl->events)) {
				common_timeout_schedule(ctl, &now, ev);
			}
		} else {
			struct event* top = NULL;
			/* See if the earliest timeout is now earlier than it
			 * was before: if so, we will need to tell the main
			 * thread to wake up earlier than it would otherwise.
			 * We double check the timeout of the top element to
			 * handle time distortions due to system suspension.
			 */
			if (min_heap_elt_is_top_(ev))
				notify = 1;
			else if ((top = min_heap_top_(&base->timeheap)) != NULL &&
					 evutil_timercmp(&top->ev_timeout, &now, <))
				notify = 1;
		}
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_add_(ev);

	return (res);
}